

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Compaction::IsTrivialMove(Compaction *this)

{
  long lVar1;
  int iVar2;
  int64_t iVar3;
  int64_t iVar4;
  long in_RDI;
  long in_FS_OFFSET;
  VersionSet *vset;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 local_19;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *files;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  files = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
          **(undefined8 **)(in_RDI + 0x10);
  iVar2 = num_input_files((Compaction *)
                          CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
  local_19 = false;
  if (iVar2 == 1) {
    iVar2 = num_input_files((Compaction *)
                            CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8),0);
    local_19 = false;
    if (iVar2 == 0) {
      iVar3 = TotalFileSize(files);
      iVar4 = MaxGrandParentOverlapBytes
                        ((Options *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
      local_19 = iVar3 <= iVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool Compaction::IsTrivialMove() const {
  const VersionSet* vset = input_version_->vset_;
  // Avoid a move if there is lots of overlapping grandparent data.
  // Otherwise, the move could create a parent file that will require
  // a very expensive merge later on.
  return (num_input_files(0) == 1 && num_input_files(1) == 0 &&
          TotalFileSize(grandparents_) <=
              MaxGrandParentOverlapBytes(vset->options_));
}